

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_ConvertSignatureToDerEmpty_Test::CryptoUtil_ConvertSignatureToDerEmpty_Test
          (CryptoUtil_ConvertSignatureToDerEmpty_Test *this)

{
  CryptoUtil_ConvertSignatureToDerEmpty_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__CryptoUtil_ConvertSignatureToDerEmpty_Test_00662af8;
  return;
}

Assistant:

TEST(CryptoUtil, ConvertSignatureToDerEmpty) {
  try {
    ByteData empty_data;
    SigHashType sig_type(SigHashAlgorithm::kSigHashAll);
    ByteData byte_data = CryptoUtil::ConvertSignatureToDer(empty_data, sig_type);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "der encode error.");
    return;
  }
  ASSERT_TRUE(false);
}